

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O1

void __thiscall ncnn::Yolov3Detection::~Yolov3Detection(Yolov3Detection *this)

{
  ~Yolov3Detection(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

Yolov3Detection::~Yolov3Detection()
{
    if (NULL != softmax)
    {
        delete softmax;
        softmax = NULL;
    }

    if (NULL != sigmoid)
    {
        delete sigmoid;
        sigmoid = NULL;
    }
}